

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  code *pcVar8;
  code *pcVar9;
  yabmp_info *local_128;
  yabmp_info *l_info;
  yabmp *l_reader;
  optparse optparsecpy;
  FILE *outStream;
  char *last_input;
  char *input;
  char *output;
  anon_struct_4_3_59474983 flags;
  int option;
  optparse optparse;
  int has_multiple_files;
  int result;
  char **argv_local;
  int argc_local;
  
  optparse._100_4_ = 0;
  optparse.subopt = 0;
  bVar3 = false;
  bVar1 = 0;
  bVar2 = false;
  input = (char *)0x0;
  outStream = (FILE *)0x0;
  optparsecpy._96_8_ = _stdout;
  pcVar6 = yabmp_basename(*argv);
  *argv = pcVar6;
  optparse_init((optparse *)&flags,argv);
  while (iVar5 = optparse_long((optparse *)&flags,main::options,(int *)0x0), iVar5 != -1) {
    if (iVar5 == 0x3f) {
      fprintf(_stderr,"%s: %s\n",*argv,&optparse.optarg);
      print_usage((FILE *)_stderr,*argv);
      optparse._100_4_ = 1;
      goto LAB_00102848;
    }
    if (iVar5 == 0x68) {
      bVar2 = true;
    }
    else if (iVar5 == 0x6f) {
      input = (char *)optparse._16_8_;
    }
    else if (iVar5 == 0x71) {
      bVar1 = 1;
    }
    else if (iVar5 == 0x76) {
      bVar3 = true;
    }
  }
  if (bVar2) {
    input = (char *)0x0;
  }
  if (((input == (char *)0x0) || (iVar5 = strcmp(input,"-"), iVar5 == 0)) ||
     (optparsecpy._96_8_ = fopen(input,"wt"), (FILE *)optparsecpy._96_8_ != (FILE *)0x0)) {
    uVar4 = optparsecpy._96_8_;
    if (bVar3) {
      pcVar6 = *argv;
      uVar7 = yabmp_get_version_string();
      fprintf((FILE *)uVar4,"%s %s\n",pcVar6,uVar7);
    }
    if (bVar2) {
      print_usage(_stdout,*argv);
    }
    else {
      last_input = optparse_arg((optparse *)&flags);
      if (last_input == (char *)0x0) {
        if (!bVar3) {
          if (bVar1 == 0) {
            fprintf(_stderr,"%s: missing file1 argument\n",*argv);
            print_usage((FILE *)_stderr,*argv);
          }
          optparse._100_4_ = 1;
        }
      }
      else {
        memcpy(&l_reader,&flags,0x68);
        pcVar6 = optparse_arg((optparse *)&l_reader);
        if (pcVar6 != (char *)0x0) {
          optparse.subopt = 1;
        }
        do {
          l_info = (yabmp_info *)0x0;
          local_128 = (yabmp_info *)0x0;
          if (optparse.subopt != 0) {
            if (outStream != (FILE *)0x0) {
              fputc(10,(FILE *)optparsecpy._96_8_);
            }
            uVar4 = optparsecpy._96_8_;
            outStream = (FILE *)last_input;
            pcVar6 = yabmp_basename(last_input);
            fprintf((FILE *)uVar4,"%s:\n",pcVar6);
          }
          pcVar9 = print_error;
          if (bVar1 != 0) {
            pcVar9 = (code *)0x0;
          }
          pcVar8 = print_warning;
          if (bVar1 != 0) {
            pcVar8 = (code *)0x0;
          }
          iVar5 = yabmp_create_reader(&l_info,0,pcVar9,pcVar8,0,0,0);
          if (iVar5 == 0) {
            iVar5 = yabmp_create_info(l_info,&local_128);
            if (iVar5 == 0) {
              if ((*last_input == '-') && (last_input[1] == '\0')) {
                stream_setmode_binary(_stdin,(uint)bVar1);
                yabmp_set_input_stream(l_info,_stdin,yabmp_file_read,0);
              }
              else {
                iVar5 = yabmp_set_input_file(l_info,last_input);
                if (iVar5 != 0) {
                  optparse._100_4_ = 1;
                  goto LAB_0010280f;
                }
              }
              iVar5 = yabmp_read_info(l_info,local_128);
              if (iVar5 == 0) {
                yabmp_printinfo((FILE *)optparsecpy._96_8_,(yabmp *)l_info,local_128);
              }
              else {
                optparse._100_4_ = 1;
              }
            }
            else {
              optparse._100_4_ = 1;
            }
          }
          else {
            optparse._100_4_ = 1;
          }
LAB_0010280f:
          yabmp_destroy_reader(&l_info,&local_128);
        } while ((optparse._100_4_ == 0) &&
                (last_input = optparse_arg((optparse *)&flags), last_input != (char *)0x0));
      }
    }
  }
  else {
    if (bVar1 == 0) {
      fprintf(_stderr,"Can\'t open file %s for writing\n",input);
    }
    optparse._100_4_ = 1;
  }
LAB_00102848:
  if (((((FILE *)optparsecpy._96_8_ != _stdout) && (optparsecpy._96_8_ != 0)) &&
      (fclose((FILE *)optparsecpy._96_8_), optparse._100_4_ != 0)) && (optparse.subopt == 0)) {
    remove(input);
  }
  return optparse._100_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	static const struct optparse_long options[] = {
		{ "version", 'v', OPTPARSE_NONE },
		{ "help",    'h', OPTPARSE_NONE },
		{ "quiet",   'q', OPTPARSE_NONE },
		{ "output",  'o', OPTPARSE_REQUIRED },
		{ 0 }
	};
	int result = EXIT_SUCCESS;
	int has_multiple_files = 0;
	struct optparse optparse;
	int option;
	struct {
		unsigned int version:1;
		unsigned int help:1;
		unsigned int quiet:1;
	} flags = {0};
	const char* output = NULL;
	const char* input = NULL;
	const char* last_input = NULL;
	FILE* outStream = stdout;
	
	argv[0] = (char*)yabmp_basename(argv[0]);
	
	optparse_init(&optparse, argv);
	
	while ((option = optparse_long(&optparse, options, NULL)) != -1) {
		switch (option) {
			case 'v':
				flags.version = 1;
				break;
			case 'h':
				flags.help = 1;
				break;
			case 'q':
				flags.quiet = 1;
				break;
			case 'o':
				output = optparse.optarg;
				break;
			case '?':
				fprintf(stderr, "%s: %s\n", argv[0], optparse.errmsg);
				print_usage(stderr, argv[0]);
				result = 1;
				goto BADEND;
		}
	}
	
	if (flags.help) {
		output = NULL;
	}
	
	if ((output != NULL) && (strcmp(output, "-") != 0)) {
		outStream = fopen(output, "wt");
		if (outStream == NULL) {
			if (!flags.quiet) {
				fprintf(stderr, "Can't open file %s for writing\n", output);
			}
			result = 1;
			goto BADEND;
		}
	}
	
	if (flags.version) {
		fprintf(outStream, "%s %s\n", argv[0], yabmp_get_version_string());
	}
	if (flags.help) {
		print_usage(stdout, argv[0]);
		goto BADEND;
	}
	
	input = optparse_arg(&optparse);
	if (input == NULL) {
		if (!flags.version) {
			if (!flags.quiet) {
				fprintf(stderr, "%s: missing file1 argument\n", argv[0]);
				print_usage(stderr, argv[0]);
			}
			result = 1;
		}
		goto BADEND;
	}
	
	/* Check for multiple files */
	{
		struct optparse optparsecpy;
		memcpy(&optparsecpy, &optparse, sizeof(optparse));
		if (optparse_arg(&optparsecpy) != NULL) {
			has_multiple_files = 1;
		}
	}
	
	do
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		if (has_multiple_files) {
			if (last_input != NULL) {
				fputc('\n', outStream);
			}
			last_input = input;
			fprintf(outStream, "%s:\n", yabmp_basename(input));
		}
		if (yabmp_create_reader(&l_reader, NULL, flags.quiet ? NULL : print_error, flags.quiet ? NULL : print_warning, NULL, NULL, NULL) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if (yabmp_create_info(l_reader, &l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if ((input[0] == '-') && (input[1] == '\0')) {
			stream_setmode_binary(stdin, flags.quiet);
			/* This can't fail with proper arguments */
			(void)yabmp_set_input_stream(l_reader, stdin, yabmp_file_read, NULL, NULL);
		} else {
			if (yabmp_set_input_file(l_reader, input) != YABMP_OK) {
				result = 1;
				goto FREE_INSTANCE;
			}
		}
		if (yabmp_read_info(l_reader, l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		yabmp_printinfo(outStream, l_reader, l_info);
FREE_INSTANCE:
		yabmp_destroy_reader(&l_reader, &l_info);
		if (result) {
			goto BADEND;
		}
	} while ((input = optparse_arg(&optparse)) != NULL);
BADEND:
	if ((outStream != stdout) && (outStream != NULL)) {
		fclose(outStream);
		if (result && !has_multiple_files) {
			(void)remove(output);
		}
	}
	
	return result;
}